

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

bool __thiscall
cfd::TransactionContext::VerifyInputSignature
          (TransactionContext *this,ByteData *signature,Pubkey *pubkey,OutPoint *outpoint,
          Script *script,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  undefined1 uVar1;
  ByteData sighash;
  void *local_88 [3];
  ByteData256 local_70;
  void *local_58 [3];
  SigHashType local_3c [12];
  
  cfd::core::SigHashType::SigHashType(local_3c,sighash_type);
  (**(code **)(*(long *)this + 0xa0))(local_58,this,outpoint,script,local_3c,value,version);
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData256::ByteData256(&local_70,(vector *)local_88);
  uVar1 = cfd::core::SignatureUtil::VerifyEcSignature(&local_70,pubkey,signature);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88[0] != (void *)0x0) {
    operator_delete(local_88[0]);
  }
  if (local_58[0] != (void *)0x0) {
    operator_delete(local_58[0]);
  }
  return (bool)uVar1;
}

Assistant:

bool TransactionContext::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const OutPoint& outpoint,
    const Script& script, SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  auto sighash =
      CreateSignatureHash(outpoint, script, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}